

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassMethodPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,FunctionPrototypeSyntax *args_2,Token *args_3)

{
  Token semi;
  ClassMethodPrototypeSyntax *pCVar1;
  ClassMethodPrototypeSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pCVar1 = (ClassMethodPrototypeSyntax *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  semi.info = in_RSI;
  semi.kind = (short)in_RDX;
  semi._2_1_ = (char)((ulong)in_RDX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  semi.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ClassMethodPrototypeSyntax::ClassMethodPrototypeSyntax
            (in_RCX,in_R8,*(TokenList **)&(in_R8->super_SyntaxListBase).super_SyntaxNode,
             (FunctionPrototypeSyntax *)(in_R8->super_SyntaxListBase)._vptr_SyntaxListBase,semi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }